

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.h
# Opt level: O2

bool __thiscall
MetaCommand::AddField
          (MetaCommand *this,string *name,string *description,TypeEnumType type,bool externalData)

{
  bool bVar1;
  string *this_00;
  undefined7 in_register_00000081;
  string *description_00;
  string *name_00;
  allocator local_12a;
  allocator local_129;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if ((int)CONCAT71(in_register_00000081,externalData) == 0) {
    std::__cxx11::string::string((string *)&local_68,(string *)name);
    std::__cxx11::string::string((string *)&local_c8,(string *)description);
    std::__cxx11::string::string((string *)&local_128,"",&local_129);
    std::__cxx11::string::string((string *)&local_e8,"",&local_12a);
    name_00 = &local_68;
    description_00 = &local_c8;
    bVar1 = AddField(this,name_00,description_00,type,DATA_NONE,&local_128,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    this_00 = &local_128;
  }
  else {
    std::__cxx11::string::string((string *)&local_48,(string *)name);
    std::__cxx11::string::string((string *)&local_88,(string *)description);
    std::__cxx11::string::string((string *)&local_108,"",&local_129);
    std::__cxx11::string::string((string *)&local_a8,"",&local_12a);
    name_00 = &local_48;
    description_00 = &local_88;
    bVar1 = AddField(this,name_00,description_00,type,DATA_IN,&local_108,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    this_00 = &local_108;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)description_00);
  std::__cxx11::string::~string((string *)name_00);
  return bVar1;
}

Assistant:

bool AddField(METAIO_STL::string name,
                METAIO_STL::string description,
                TypeEnumType type,
                bool externalData
                )
    {
    if(externalData)
      {
      return this->AddField(name,description,type,DATA_IN);
      }
    return this->AddField(name,description,type,DATA_NONE);
    }